

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_table.c
# Opt level: O1

int amqp_table_entry_cmp(void *entry1,void *entry2)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  ulong __n;
  
  uVar1 = *entry1;
  uVar2 = *entry2;
  __n = uVar1;
  if (uVar2 < uVar1) {
    __n = uVar2;
  }
  iVar3 = memcmp(*(void **)((long)entry1 + 8),*(void **)((long)entry2 + 8),__n);
  if (iVar3 == 0) {
    iVar3 = (int)uVar1 - (int)uVar2;
  }
  return iVar3;
}

Assistant:

int amqp_table_entry_cmp(void const *entry1, void const *entry2) {
  amqp_table_entry_t const *p1 = (amqp_table_entry_t const *)entry1;
  amqp_table_entry_t const *p2 = (amqp_table_entry_t const *)entry2;

  int d;
  size_t minlen;

  minlen = p1->key.len;
  if (p2->key.len < minlen) {
    minlen = p2->key.len;
  }

  d = memcmp(p1->key.bytes, p2->key.bytes, minlen);
  if (d != 0) {
    return d;
  }

  return (int)p1->key.len - (int)p2->key.len;
}